

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeInternalForces_impl
          (ChElementBeamIGA *this,ChVectorDynamic<> *Fi,ChState *state_x,ChStateDelta *state_w,
          bool used_for_differentiation)

{
  ChVectorDynamic<> *pCVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  Scalar *pSVar16;
  ulong uVar17;
  ChQuadratureTables *pCVar18;
  Scalar *pSVar19;
  pointer psVar20;
  pointer pCVar21;
  ChVector<double> *pCVar22;
  pointer psVar23;
  long lVar24;
  long lVar25;
  _Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false> _Var26;
  int i_4;
  Index start;
  int i;
  ulong uVar27;
  long lVar28;
  _Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false> _Var29;
  int i_6;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM16 [16];
  ChVector<double> local_3b8;
  ChVectorDynamic<> *local_3a0;
  ChVector<double> local_398;
  double local_378;
  ChMatrixDynamic<> N;
  ChVector<double> r_i;
  ChVector<double> mTgyro_i_1;
  ChQuaternion<double> q_i;
  undefined1 local_298 [16];
  double local_288;
  undefined1 local_278 [16];
  double local_268;
  ChVector<double> wl_i_1;
  ChVector<double> delta_rot_dir;
  ChVector<double> wl_i;
  double delta_rot_angle;
  ChQuaternion<double> qda;
  ChQuaternion<double> q_i_4;
  ChVector<double> v_1;
  ChMatrix33<double> R;
  ChQuaternion<double> qR;
  ChVector<double> Force_i;
  vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
  foo_plastic_data;
  ChVector<double> astrain_e_dt;
  ChVector<double> *local_70 [2];
  ChVector<double> astrain_k_dt;
  ChVector<double> Torque_i;
  
  pCVar1 = &this->knots;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar1,
                       (long)this->order);
  local_3a0 = (ChVectorDynamic<> *)*pSVar16;
  pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pCVar1,
                       ~(long)this->order +
                       (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
  dVar7 = (*pSVar16 - (double)local_3a0) * 0.5;
  dVar8 = ((double)local_3a0 + *pSVar16) * 0.5;
  local_3a0 = Fi;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Fi);
  lVar24 = 0;
  while( true ) {
    uVar17 = (ulong)this->int_order_b;
    if ((long)uVar17 <= lVar24) break;
    pCVar18 = ChQuadrature::GetStaticTables();
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar8;
    auVar35._8_8_ = 0;
    auVar35._0_8_ =
         *(ulong *)(*(long *)&(pCVar18->Lroots).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start
                              [(long)this->int_order_b + -1].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + lVar24 * 8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar7;
    auVar9 = vfmadd132sd_fma(auVar35,auVar31,auVar30);
    pCVar18 = ChQuadrature::GetStaticTables();
    uVar17 = *(ulong *)(*(long *)&(pCVar18->Weight).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)this->int_order_b + -1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar24 * 8);
    local_378 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar24];
    iVar4 = this->order;
    R.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_ = 2
    ;
    q_i.m_data[0]._0_4_ =
         (undefined4)
         ((ulong)((long)(this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
    Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
              ((Matrix<double,_1,_1,1,_1,_1> *)&N,(int *)&R,(int *)&q_i);
    geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order,iVar4,auVar9._0_8_,pCVar1,&N);
    delta_rot_dir.m_data[2] = 0.0;
    q_i_4.m_data[0] = 0.0;
    q_i_4.m_data[1] = 0.0;
    q_i_4.m_data[2] = 0.0;
    q_i_4.m_data[3] = 0.0;
    local_3b8.m_data[0] = VNULL;
    local_3b8.m_data[1] = DAT_011dd3e0;
    local_3b8.m_data[2] = DAT_011dd3e8;
    delta_rot_dir.m_data._0_16_ = ZEXT816(0);
    lVar25 = 3;
    for (uVar27 = 0;
        uVar27 < (ulong)((long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar27 = uVar27 + 1)
    {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                 &state_x->super_ChVectorDynamic<double>,lVar25,4);
      ChQuaternion<double>::ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                (&q_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&R,(type *)0x0);
      peVar5 = (((this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      qda.m_data[0] = *(double *)&peVar5->field_0x38;
      auVar36._0_8_ = *(ulong *)&peVar5->field_0x50 ^ 0x8000000000000000;
      auVar36._8_8_ = 0x8000000000000000;
      qda.m_data[1] = -*(double *)&peVar5->field_0x40;
      qda.m_data[2] = -*(double *)&peVar5->field_0x48;
      qda.m_data[3] = (double)vmovlpd_avx(auVar36);
      ChQuaternion<double>::operator*((ChQuaternion<double> *)&R,&qda,&q_i);
      q_i_4.m_data[0] =
           (double)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0]._4_4_,
                            R.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[0]._0_4_);
      q_i_4.m_data[1] =
           R.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      q_i_4.m_data[2] =
           R.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      q_i_4.m_data[3] =
           R.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      ChQuaternion<double>::Q_to_AngAxis(&q_i_4,&delta_rot_angle,&delta_rot_dir);
      dVar61 = delta_rot_angle;
      dVar58 = delta_rot_dir.m_data[2];
      dVar47 = delta_rot_dir.m_data[0];
      dVar48 = delta_rot_dir.m_data[1];
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                           uVar27);
      dVar43 = *pSVar19;
      lVar25 = lVar25 + 7;
      local_3b8.m_data[0] = dVar61 * dVar47 * dVar43 + local_3b8.m_data[0];
      local_3b8.m_data[1] = dVar61 * dVar48 * dVar43 + local_3b8.m_data[1];
      local_3b8.m_data[2] = dVar61 * dVar58 * dVar43 + local_3b8.m_data[2];
    }
    qda.m_data[0] = 0.0;
    qda.m_data[1] = 0.0;
    qda.m_data[2] = 0.0;
    qda.m_data[3] = 0.0;
    ChQuaternion<double>::Q_from_Rotv(&qda,&local_3b8);
    ChQuaternion<double>::operator*
              (&qR,(ChQuaternion<double> *)
                   &((((this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->field_0x38,&qda);
    ChMatrix33<double>::Set_A_quaternion(&R,&qR);
    local_398.m_data[2] = 0.0;
    lVar25 = 0;
    uVar27 = 0;
    local_398.m_data[0] = 0.0;
    local_398.m_data[1] = 0.0;
    while( true ) {
      psVar23 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)psVar23 - (long)psVar20 >> 4) <= uVar27) break;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_x->super_ChVectorDynamic<double>,lVar25,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                (&r_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&q_i,(type *)0x0);
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar27);
      dVar43 = *pSVar19;
      uVar27 = uVar27 + 1;
      lVar25 = lVar25 + 7;
      local_398.m_data[0] = dVar43 * r_i.m_data[0] + local_398.m_data[0];
      local_398.m_data[1] = dVar43 * r_i.m_data[1] + local_398.m_data[1];
      local_398.m_data[2] = dVar43 * r_i.m_data[2] + local_398.m_data[2];
    }
    wl_i_1.m_data[2] = 0.0;
    lVar25 = 0;
    dVar43 = 1.0 / local_378;
    local_398.m_data[0] = dVar43 * local_398.m_data[0];
    local_398.m_data[1] = dVar43 * local_398.m_data[1];
    local_398.m_data[2] = dVar43 * local_398.m_data[2];
    wl_i_1.m_data[0] = 0.0;
    wl_i_1.m_data[1] = 0.0;
    for (uVar27 = 0; uVar27 < (ulong)((long)psVar23 - (long)psVar20 >> 4); uVar27 = uVar27 + 1) {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_w->super_ChVectorDynamic<double>,lVar25,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                (&r_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                       *)&q_i,(type *)0x0);
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar27);
      dVar47 = *pSVar19;
      lVar25 = lVar25 + 6;
      wl_i_1.m_data[0] = dVar47 * r_i.m_data[0] + wl_i_1.m_data[0];
      wl_i_1.m_data[1] = dVar47 * r_i.m_data[1] + wl_i_1.m_data[1];
      wl_i_1.m_data[2] = dVar47 * r_i.m_data[2] + wl_i_1.m_data[2];
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar23 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    wl_i_1.m_data[0] = wl_i_1.m_data[0] * dVar43;
    wl_i_1.m_data[1] = wl_i_1.m_data[1] * dVar43;
    wl_i_1.m_data[2] = wl_i_1.m_data[2] * dVar43;
    lVar25 = 3;
    local_3b8.m_data[2] = DAT_011dd3e8;
    local_3b8.m_data[0] = VNULL;
    local_3b8.m_data[1] = DAT_011dd3e0;
    for (uVar27 = 0; uVar27 < (ulong)((long)psVar23 - (long)psVar20 >> 4); uVar27 = uVar27 + 1) {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_x->super_ChVectorDynamic<double>,lVar25,4);
      ChQuaternion<double>::ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                ((ChQuaternion<double> *)&r_i,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &q_i,(type *)0x0);
      auVar37._0_8_ = -qR.m_data[3];
      auVar37._8_8_ = 0x8000000000000000;
      mTgyro_i_1.m_data[1] = -qR.m_data[1];
      mTgyro_i_1.m_data[2] = -qR.m_data[2];
      mTgyro_i_1.m_data[0] = qR.m_data[0];
      vmovlpd_avx(auVar37);
      ChQuaternion<double>::operator*
                (&q_i,(ChQuaternion<double> *)&mTgyro_i_1,(ChQuaternion<double> *)&r_i);
      q_i_4.m_data[0] = (double)CONCAT44(q_i.m_data[0]._4_4_,q_i.m_data[0]._0_4_);
      q_i_4.m_data[1] = q_i.m_data[1];
      q_i_4.m_data[2] = q_i.m_data[2];
      q_i_4.m_data[3] = q_i.m_data[3];
      ChQuaternion<double>::Q_to_AngAxis(&q_i_4,&delta_rot_angle,&delta_rot_dir);
      dVar2 = delta_rot_angle;
      dVar61 = delta_rot_dir.m_data[2];
      dVar48 = delta_rot_dir.m_data[0];
      dVar58 = delta_rot_dir.m_data[1];
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar27);
      dVar47 = *pSVar19;
      lVar25 = lVar25 + 7;
      local_3b8.m_data[0] = dVar2 * dVar48 * dVar47 + local_3b8.m_data[0];
      local_3b8.m_data[1] = dVar2 * dVar58 * dVar47 + local_3b8.m_data[1];
      local_3b8.m_data[2] = dVar2 * dVar61 * dVar47 + local_3b8.m_data[2];
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar23 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_3b8.m_data[0] = local_3b8.m_data[0] * dVar43;
    local_3b8.m_data[1] = local_3b8.m_data[1] * dVar43;
    mTgyro_i_1.m_data[2] = 0.0;
    local_3b8.m_data[2] = local_3b8.m_data[2] * dVar43;
    mTgyro_i_1.m_data[0] = 0.0;
    mTgyro_i_1.m_data[1] = 0.0;
    lVar25 = 3;
    lVar28 = lVar25;
    for (uVar27 = 0; uVar27 < (ulong)((long)psVar23 - (long)psVar20 >> 4); uVar27 = uVar27 + 1) {
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_x->super_ChVectorDynamic<double>,lVar25,4);
      ChQuaternion<double>::ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                ((ChQuaternion<double> *)&r_i,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &q_i,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_w->super_ChVectorDynamic<double>,lVar28,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                (&wl_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&q_i,(type *)0x0);
      ChQuaternion<double>::Rotate((ChQuaternion<double> *)&r_i,&wl_i);
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar27);
      dVar47 = *pSVar19;
      lVar28 = lVar28 + 6;
      lVar25 = lVar25 + 7;
      mTgyro_i_1.m_data[0] =
           dVar47 * (double)CONCAT44(q_i.m_data[0]._4_4_,q_i.m_data[0]._0_4_) + mTgyro_i_1.m_data[0]
      ;
      mTgyro_i_1.m_data[1] = dVar47 * q_i.m_data[1] + mTgyro_i_1.m_data[1];
      mTgyro_i_1.m_data[2] = dVar47 * q_i.m_data[2] + mTgyro_i_1.m_data[2];
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar23 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    mTgyro_i_1.m_data[0] = mTgyro_i_1.m_data[0] * dVar43;
    mTgyro_i_1.m_data[1] = mTgyro_i_1.m_data[1] * dVar43;
    mTgyro_i_1.m_data[2] = mTgyro_i_1.m_data[2] * dVar43;
    r_i.m_data[0] = (double)&R;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&r_i,&local_398);
    pCVar21 = (this->strain_e_0).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar12._4_4_ = q_i.m_data[0]._4_4_;
    auVar12._0_4_ = q_i.m_data[0]._0_4_;
    auVar12._8_8_ = q_i.m_data[1];
    auVar9 = vsubpd_avx(auVar12,_VECT_X);
    wl_i.m_data._0_16_ = vsubpd_avx(auVar9,*(undefined1 (*) [16])pCVar21[lVar24].m_data);
    wl_i.m_data[2] = (q_i.m_data[2] - DAT_011dd400) - pCVar21[lVar24].m_data[2];
    q_i.m_data[0] = (double)&R;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&q_i,&wl_i_1);
    pCVar21 = (this->strain_k_0).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar11._8_8_ = local_3b8.m_data[1];
    auVar11._0_8_ = local_3b8.m_data[0];
    v_1.m_data._0_16_ = vsubpd_avx(auVar11,*(undefined1 (*) [16])pCVar21[lVar24].m_data);
    v_1.m_data[2] = local_3b8.m_data[2] - pCVar21[lVar24].m_data[2];
    q_i.m_data[0] = (double)&R;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&q_i,&mTgyro_i_1);
    foo_plastic_data.
    super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278._0_8_ = 0.0;
    stack0xfffffffffffffd90 = ZEXT816(0);
    local_298._0_8_ = 0.0;
    stack0xfffffffffffffd70 = ZEXT816(0);
    foo_plastic_data.
    super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    foo_plastic_data.
    super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2> *)&q_i,
               &(((this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->plasticity).
                super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>);
    dVar43 = q_i.m_data[0];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(q_i.m_data + 1));
    _Var29._M_head_impl = (ChBeamMaterialInternalData *)0x0;
    _Var26._M_head_impl = (ChBeamMaterialInternalData *)0x0;
    if (dVar43 != 0.0) {
      _Var29._M_head_impl =
           *(ChBeamMaterialInternalData **)
            &(this->plastic_data_old).
             super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar24]._M_t.
             super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
             ._M_t;
      if (used_for_differentiation) {
        std::__shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                     &q_i,&(((this->section).
                             super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->plasticity).
                           super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    );
        (**(code **)(*(long *)q_i.m_data[0] + 0x20))(q_i.m_data[0],1,&foo_plastic_data);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(q_i.m_data + 1));
        _Var26._M_head_impl =
             ((foo_plastic_data.
               super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
             ._M_t.
             super__Tuple_impl<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
             .super__Head_base<0UL,_chrono::fea::ChBeamMaterialInternalData_*,_false>._M_head_impl;
      }
      else {
        _Var26._M_head_impl =
             *(ChBeamMaterialInternalData **)
              &(this->plastic_data).
               super__Vector_base<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar24]._M_t.
               super___uniq_ptr_impl<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>
               ._M_t;
      }
    }
    peVar6 = (this->section).
             super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar6->super_ChBeamSection)._vptr_ChBeamSection[2])
              (peVar6,local_278,local_298,&wl_i,&v_1,_Var26._M_head_impl,_Var29._M_head_impl);
    if (!used_for_differentiation) {
      pCVar21 = (this->stress_n).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24;
      if ((pointer)local_278 != pCVar21) {
        pCVar21->m_data[0] = (double)local_278._0_8_;
        pCVar21->m_data[1] = (double)local_278._8_8_;
        pCVar21->m_data[2] = local_268;
      }
      pCVar21 = (this->stress_m).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24;
      if ((pointer)local_298 != pCVar21) {
        pCVar21->m_data[0] = (double)local_298._0_8_;
        pCVar21->m_data[1] = (double)local_298._8_8_;
        pCVar21->m_data[2] = local_288;
      }
      pCVar22 = (this->strain_e).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24;
      if (&wl_i != pCVar22) {
        pCVar22->m_data[0] = wl_i.m_data[0];
        pCVar22->m_data[1] = wl_i.m_data[1];
        pCVar22->m_data[2] = wl_i.m_data[2];
      }
      pCVar22 = (this->strain_k).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar24;
      if (&v_1 != pCVar22) {
        pCVar22->m_data[0] = v_1.m_data[0];
        pCVar22->m_data[1] = v_1.m_data[1];
        pCVar22->m_data[2] = v_1.m_data[2];
      }
    }
    std::__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2> *)&q_i,
               &(((this->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->damping).
                super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>);
    dVar43 = q_i.m_data[0];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(q_i.m_data + 1));
    if (dVar43 != 0.0) {
      q_i.m_data[2] = 0.0;
      r_i.m_data[2] = 0.0;
      q_i.m_data[0]._0_4_ = 0;
      q_i.m_data[0]._4_4_ = 0;
      q_i.m_data[1] = 0.0;
      r_i.m_data[0] = 0.0;
      r_i.m_data[1] = 0.0;
      std::__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                 &Force_i,&(((this->section).
                             super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->damping).
                           super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>
                );
      (**(code **)(*(long *)Force_i.m_data[0] + 0x10))
                (Force_i.m_data[0],
                 (__shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2> *)&q_i
                 ,&r_i,&astrain_e_dt,&astrain_k_dt);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(Force_i.m_data + 1));
      local_278._0_8_ = q_i.m_data[0] + (double)local_278._0_8_;
      local_278._8_8_ = q_i.m_data[1] + (double)local_278._8_8_;
      local_268 = q_i.m_data[2] + local_268;
      local_298._0_8_ = r_i.m_data[0] + (double)local_298._0_8_;
      local_298._8_8_ = r_i.m_data[1] + (double)local_298._8_8_;
      local_288 = r_i.m_data[2] + local_288;
    }
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar9 = vshufpd_avx(stack0xfffffffffffffd90,stack0xfffffffffffffd90,1);
    auVar51._4_4_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _4_4_;
    auVar51._0_4_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _0_4_;
    auVar51._8_8_ = 0;
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    lVar28 = 0;
    dVar47 = local_278._8_8_;
    dVar43 = local_298._8_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_278._0_8_;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         dVar47;
    auVar34 = vfmadd231sd_fma(auVar49,auVar64,auVar44);
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
         dVar47;
    auVar41 = vfmadd231sd_fma(auVar59,auVar51,auVar44);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_298._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
         dVar43;
    auVar42 = vfmadd231sd_fma(auVar54,auVar32,auVar51);
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar47;
    auVar30 = vfmadd231sd_fma(auVar62,auVar65,auVar44);
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar43;
    auVar31 = vfmadd231sd_fma(auVar52,auVar32,auVar65);
    auVar34 = vfmadd231sd_fma(auVar34,auVar63,auVar9);
    auVar41 = vfmadd231sd_fma(auVar41,auVar56,auVar9);
    auVar30 = vfmadd231sd_fma(auVar30,auVar60,auVar9);
    dVar48 = auVar34._0_8_;
    auVar9 = vshufpd_avx(stack0xfffffffffffffd70,stack0xfffffffffffffd70,1);
    dVar58 = auVar41._0_8_;
    dVar61 = auVar30._0_8_;
    auVar34 = vfmadd231sd_fma(auVar42,auVar9,auVar56);
    auVar41 = vfmadd231sd_fma(auVar31,auVar9,auVar60);
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         R.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         dVar43;
    auVar42 = vfmadd231sd_fma(auVar38,auVar64,auVar32);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar17;
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar30 = vxorpd_avx512vl(auVar13,auVar10);
    dVar43 = auVar30._0_8_ * dVar7;
    auVar9 = vfmadd231sd_fma(auVar42,auVar63,auVar9);
    dVar47 = dVar43 * local_378;
    lVar25 = 3;
    for (uVar17 = 0;
        uVar17 < (ulong)((long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar17 = uVar17 + 1)
    {
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar17);
      dVar2 = *pSVar19;
      r_i.m_data[0] = (double)&Force_i;
      Force_i.m_data[0] = dVar43 * dVar2 * dVar58;
      Force_i.m_data[1] = dVar43 * dVar2 * dVar61;
      Force_i.m_data[2] = dVar43 * dVar2 * dVar48;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,local_3a0,lVar28,3)
      ;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&q_i,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&r_i);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,
                 &state_x->super_ChVectorDynamic<double>,lVar25,4);
      ChQuaternion<double>::ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                ((ChQuaternion<double> *)&r_i,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &q_i,(type *)0x0);
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,1,
                           uVar17);
      dVar15 = local_398.m_data[2];
      dVar14 = local_398.m_data[0];
      dVar2 = *pSVar19;
      local_378 = local_398.m_data[1];
      pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                           uVar17);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar58;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_378;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = dVar61;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar14;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = dVar48;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar15;
      dVar3 = *pSVar19;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar58 * local_378;
      auVar42 = vfmsub231sd_fma(auVar33,auVar39,auVar50);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar48 * dVar14;
      auVar30 = vfmsub231sd_fma(auVar40,auVar57,auVar45);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar61 * dVar15;
      auVar31 = vfmsub231sd_fma(auVar46,auVar53,auVar55);
      q_i.m_data[0] = dVar43 * dVar2 * auVar34._0_8_ - dVar47 * dVar3 * auVar31._0_8_;
      q_i.m_data[1] = dVar43 * dVar2 * auVar41._0_8_ - dVar47 * dVar3 * auVar30._0_8_;
      q_i.m_data[2] = dVar43 * dVar2 * auVar9._0_8_ - dVar47 * dVar3 * auVar42._0_8_;
      ChQuaternion<double>::RotateBack((ChQuaternion<double> *)&r_i,(ChVector<double> *)&q_i);
      local_70[0] = &Torque_i;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&q_i,local_3a0,
                 lVar28 + 3,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&q_i,
                 (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_70);
      lVar25 = lVar25 + 7;
      lVar28 = lVar28 + 6;
    }
    std::
    vector<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>,_std::allocator<std::unique_ptr<chrono::fea::ChBeamMaterialInternalData,_std::default_delete<chrono::fea::ChBeamMaterialInternalData>_>_>_>
    ::~vector(&foo_plastic_data);
    Eigen::internal::handmade_aligned_free
              (N.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
    lVar24 = lVar24 + 1;
  }
  if (add_gyroscopic_terms != '\0') {
    if (lumped_mass == '\x01') {
      psVar20 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar23 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      qR.m_data[2] = 0.0;
      auVar9 = vcvtusi2sd_avx512f(in_XMM16,(long)psVar20 - (long)psVar23 >> 4);
      N.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)((this->super_ChElementBeam).length / auVar9._0_8_);
      qda.m_data[2] = 0.0;
      qda.m_data[0] = 0.0;
      qda.m_data[1] = 0.0;
      qR.m_data[0] = 0.0;
      qR.m_data[1] = 0.0;
      start = 3;
      lVar24 = 0;
      for (uVar17 = 0; uVar17 < (ulong)((long)psVar20 - (long)psVar23 >> 4); uVar17 = uVar17 + 1) {
        std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)
                   &q_i_4,&(((this->section).
                             super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->inertia).
                           super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>
                  );
        dVar7 = q_i_4.m_data[0];
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                   &state_w->super_ChVectorDynamic<double>,lVar24 + 3,3);
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  ((ChVector<double> *)&q_i,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&R,(type *)0x0);
        (**(code **)(*(long *)dVar7 + 0x28))
                  (dVar7,&qda,&qR,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&q_i);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(q_i_4.m_data + 1));
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                   &state_x->super_ChVectorDynamic<double>,start,4);
        ChQuaternion<double>::
        ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                  (&q_i_4,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                           *)&R,(type *)0x0);
        ChQuaternion<double>::Rotate(&q_i_4,(ChVector<double> *)&qda);
        mTgyro_i_1.m_data[0] = (double)&r_i;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)&q_i,(double *)&N,(StorageBaseType *)&mTgyro_i_1);
        pCVar1 = local_3a0;
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,local_3a0,lVar24,3)
        ;
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&R,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&q_i);
        r_i.m_data[0] = (double)&qR;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)&q_i,(double *)&N,(StorageBaseType *)&r_i);
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,pCVar1,lVar24 + 3,3
                  );
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&R,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&q_i);
        psVar23 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar20 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        start = start + 7;
        lVar24 = lVar24 + 6;
      }
    }
    else {
      mTgyro_i_1.m_data[2] = 0.0;
      r_i.m_data[2] = 0.0;
      r_i.m_data[0] = 0.0;
      r_i.m_data[1] = 0.0;
      mTgyro_i_1.m_data[0] = 0.0;
      mTgyro_i_1.m_data[1] = 0.0;
      dVar43 = 0.0;
      while ((long)dVar43 < (long)(int)uVar17) {
        pCVar18 = ChQuadrature::GetStaticTables();
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar8;
        auVar41._8_8_ = 0;
        auVar41._0_8_ =
             *(ulong *)(*(long *)&(pCVar18->Lroots).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(long)this->int_order_b + -1].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + (long)dVar43 * 8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar7;
        auVar9 = vfmadd132sd_fma(auVar41,auVar34,auVar9);
        pCVar18 = ChQuadrature::GetStaticTables();
        iVar4 = this->order;
        dVar47 = *(double *)
                  (*(long *)&(pCVar18->Weight).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)this->int_order_b + -1]
                             .super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  (long)dVar43 * 8);
        dVar48 = (this->Jacobian_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)dVar43];
        R.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._0_4_
             = 1;
        q_i.m_data[0]._0_4_ =
             (undefined4)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
        local_378 = dVar43;
        Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                  ((Matrix<double,_1,_1,1,_1,_1> *)&N,(int *)&R,(int *)&q_i);
        geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order,iVar4,auVar9._0_8_,pCVar1,&N);
        delta_rot_dir.m_data[2] = 0.0;
        q_i_4.m_data[0] = 0.0;
        q_i_4.m_data[1] = 0.0;
        q_i_4.m_data[2] = 0.0;
        q_i_4.m_data[3] = 0.0;
        local_3b8.m_data[0] = VNULL;
        local_3b8.m_data[1] = DAT_011dd3e0;
        local_3b8.m_data[2] = DAT_011dd3e8;
        delta_rot_dir.m_data._0_16_ = ZEXT816(0) << 0x20;
        lVar24 = 3;
        for (uVar17 = 0;
            uVar17 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar17 = uVar17 + 1) {
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                     &state_x->super_ChVectorDynamic<double>,lVar24,4);
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&q_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                           *)&R,(type *)0x0);
          peVar5 = (((this->nodes).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          qda.m_data[0] = *(double *)&peVar5->field_0x38;
          auVar42._0_8_ = *(ulong *)&peVar5->field_0x50 ^ 0x8000000000000000;
          auVar42._8_4_ = 0;
          auVar42._12_4_ = 0x80000000;
          qda.m_data[1] = -*(double *)&peVar5->field_0x40;
          qda.m_data[2] = -*(double *)&peVar5->field_0x48;
          qda.m_data[3] = (double)vmovlps_avx(auVar42);
          ChQuaternion<double>::operator*((ChQuaternion<double> *)&R,&qda,&q_i);
          q_i_4.m_data[0] =
               (double)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0]._4_4_,
                                R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[0]._0_4_);
          q_i_4.m_data[1] =
               R.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          q_i_4.m_data[2] =
               R.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
          q_i_4.m_data[3] =
               R.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          ChQuaternion<double>::Q_to_AngAxis(&q_i_4,astrain_e_dt.m_data,&delta_rot_dir);
          dVar3 = astrain_e_dt.m_data[0];
          dVar2 = delta_rot_dir.m_data[2];
          dVar58 = delta_rot_dir.m_data[0];
          dVar61 = delta_rot_dir.m_data[1];
          pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                               uVar17);
          dVar43 = *pSVar19;
          lVar24 = lVar24 + 7;
          local_3b8.m_data[0] = dVar3 * dVar58 * dVar43 + local_3b8.m_data[0];
          local_3b8.m_data[1] = dVar3 * dVar61 * dVar43 + local_3b8.m_data[1];
          local_3b8.m_data[2] = dVar3 * dVar2 * dVar43 + local_3b8.m_data[2];
        }
        qda.m_data[0] = 0.0;
        qda.m_data[1] = 0.0;
        qda.m_data[2] = 0.0;
        qda.m_data[3] = 0.0;
        ChQuaternion<double>::Q_from_Rotv(&qda,&local_3b8);
        ChQuaternion<double>::operator*
                  (&qR,(ChQuaternion<double> *)
                       &((((this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->field_0x38,&qda);
        local_398.m_data[2] = 0.0;
        local_398.m_data[0] = 0.0;
        local_398.m_data[1] = 0.0;
        lVar24 = 3;
        lVar25 = lVar24;
        for (uVar17 = 0;
            uVar17 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar17 = uVar17 + 1) {
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                     &state_x->super_ChVectorDynamic<double>,lVar24,4);
          ChQuaternion<double>::
          ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&q_i,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                           *)&R,(type *)0x0);
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,
                     &state_w->super_ChVectorDynamic<double>,lVar25,3);
          ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                    (&wl_i_1,(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                              *)&R,(type *)0x0);
          ChQuaternion<double>::Rotate(&q_i,&wl_i_1);
          pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                               uVar17);
          dVar43 = *pSVar19;
          lVar25 = lVar25 + 6;
          lVar24 = lVar24 + 7;
          local_398.m_data[0] =
               dVar43 * (double)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[0]._4_4_,
                                         R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                         .m_storage.m_data.array[0]._0_4_) + local_398.m_data[0];
          local_398.m_data[1] =
               dVar43 * R.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[1] + local_398.m_data[1];
          local_398.m_data[2] =
               dVar43 * R.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array[2] + local_398.m_data[2];
        }
        ChQuaternion<double>::RotateBack(&qR,&local_398);
        local_398.m_data[0] =
             (double)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0]._4_4_,
                              R.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0]._0_4_);
        local_398.m_data[1] =
             R.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        local_398.m_data[2] =
             R.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        std::__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2> *)&R,
                   &(((this->section).
                      super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->inertia).
                    super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>);
        (**(code **)(*(long *)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array[0]._4_4_,
                                       R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                       m_storage.m_data.array[0]._0_4_) + 0x28))
                  ((long *)CONCAT44(R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[0]._4_4_,
                                    R.super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array[0]._0_4_),&r_i,&mTgyro_i_1,&local_398);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (R.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 1));
        lVar24 = 0;
        dVar43 = dVar48 * dVar47 * dVar7;
        for (uVar17 = 0;
            uVar17 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
            uVar17 = uVar17 + 1) {
          pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                               uVar17);
          v_1.m_data[0] = dVar43 * *pSVar19;
          ChQuaternion<double>::Rotate(&qR,&r_i);
          wl_i.m_data[0] = (double)&wl_i_1;
          Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)&q_i,v_1.m_data,(StorageBaseType *)&wl_i);
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,local_3a0,lVar24,
                     3);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&R,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)&q_i);
          pSVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&N,0,
                               uVar17);
          wl_i_1.m_data[0] = (double)&mTgyro_i_1;
          wl_i.m_data[0] = dVar43 * *pSVar19;
          Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                            *)&q_i,wl_i.m_data,(StorageBaseType *)&wl_i_1);
          Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                    ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&R,local_3a0,
                     lVar24 + 3,3);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&R,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                      *)&q_i);
          lVar24 = lVar24 + 6;
        }
        Eigen::internal::handmade_aligned_free
                  (N.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                   m_data);
        uVar17 = (ulong)(uint)this->int_order_b;
        dVar43 = (double)((long)local_378 + 1);
      }
    }
  }
  return;
}

Assistant:

void ChElementBeamIGA::ComputeInternalForces_impl(ChVectorDynamic<>& Fi,
                                                  ChState& state_x,
                                                  ChStateDelta& state_w,
                                                  bool used_for_differentiation) {
    // get two values of absyssa at extreme of span
    double u1 = knots(order);
    double u2 = knots(knots.size() - order - 1);

    double c1 = (u2 - u1) / 2;
    double c2 = (u2 + u1) / 2;

    // zero the Fi accumulator
    Fi.setZero();

    // Do quadrature over the "s" shear Gauss points
    // (only if int_order_b != int_order_s, otherwise do a single loop later over "b" bend points also for shear)

    //***TODO*** maybe not needed: separate bending and shear integration points.

    // Do quadrature over the "b" bend Gauss points

    for (int ig = 0; ig < int_order_b; ++ig) {
        // absyssa in typical -1,+1 range:
        double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
        // absyssa in span range:
        double u = (c1 * eta + c2);
        // scaling = gauss weight
        double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

        // Jacobian Jsu = ds/du
        double Jsu = this->Jacobian_b[ig];
        // Jacobian Jue = du/deta
        double Jue = c1;

        // compute the basis functions N(u) at given u:
        int nspan = order;

        ChMatrixDynamic<> N(2, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du

        geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                          N);  ///< here return N and dN/du

        // interpolate rotation of section at given u, to compute R.
        // Note: this is approximate.
        // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
        ChQuaternion<> q_delta;
        ChVector<> da = VNULL;
        ChVector<> delta_rot_dir;
        double delta_rot_angle;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
        }
        ChQuaternion<> qda;
        qda.Q_from_Rotv(da);
        ChQuaternion<> qR = nodes[0]->coord.rot * qda;

        // compute the 3x3 rotation matrix R equivalent to quaternion above
        ChMatrix33<> R(qR);

        // compute abs. spline gradient r'  = dr/ds
        ChVector<> dr;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> r_i(state_x.segment(i * 7, 3));
            dr += r_i * N(1, i);  // dr/du = N_i'*r_i
        }
        // (note r'= dr/ds = dr/du du/ds = dr/du * 1/Jsu   where Jsu computed in SetupInitial)
        dr *= 1.0 / Jsu;

        // compute abs. time rate of spline gradient  dr'/dt
        ChVector<> drdt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChVector<> drdt_i(state_w.segment(i * 6, 3));
            drdt += drdt_i * N(1, i);
        }
        drdt *= 1.0 / Jsu;

        // compute abs spline rotation gradient q' = dq/ds
        // But.. easier to compute local gradient of spin vector a' = da/ds
        da = VNULL;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            q_delta = qR.GetConjugate() * q_i;
            q_delta.Q_to_AngAxis(delta_rot_angle,
                                 delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
            da += delta_rot_dir * delta_rot_angle * N(1, i);  // da/du = N_i'*a_i
        }
        // (note a= da/ds = da/du du/ds = da/du * 1/Jsu   where Jsu computed in SetupInitial)
        da *= 1.0 / Jsu;

        // compute abs rate of spline rotation gradient da'/dt
        ChVector<> dadt;
        for (int i = 0; i < nodes.size(); ++i) {
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
            ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
            dadt += w_i * N(1, i);
        }
        dadt *= 1.0 / Jsu;

        // compute local epsilon strain:  strain_e= R^t * r' - {1, 0, 0}
        ChVector<> astrain_e = R.transpose() * dr - VECT_X - this->strain_e_0[ig];

        // compute local time rate of strain:  strain_e_dt = R^t * dr'/dt
        ChVector<> astrain_e_dt = R.transpose() * drdt;

        // compute local curvature strain:  strain_k= 2*[F(q*)(+)] * q' = 2*[F(q*)(+)] * N_i'*q_i = R^t * a' = a'_local
        ChVector<> astrain_k = da - this->strain_k_0[ig];

        // compute local time rate of curvature strain:
        ChVector<> astrain_k_dt = R.transpose() * dadt;

        // compute stress n  (local cut forces)
        // compute stress_m  (local cut torque)
        ChVector<> astress_n;
        ChVector<> astress_m;
        ChBeamMaterialInternalData* aplastic_data_old = nullptr;
        ChBeamMaterialInternalData* aplastic_data = nullptr;
        std::vector<std::unique_ptr<ChBeamMaterialInternalData>> foo_plastic_data;
        if (this->section->GetPlasticity()) {
            aplastic_data_old = this->plastic_data_old[ig].get();
            aplastic_data = this->plastic_data[ig].get();
            if (used_for_differentiation) {
                // Avoid updating plastic_data_new if ComputeInternalForces_impl() called for computing
                // stiffness matrix by backward differentiation. Otherwise pollutes the plastic_data integration.
                this->section->GetPlasticity()->CreatePlasticityData(1, foo_plastic_data);
                aplastic_data = foo_plastic_data[0].get();
            }
        }
        this->section->ComputeStress(astress_n, astress_m, astrain_e, astrain_k, aplastic_data, aplastic_data_old);

        if (!used_for_differentiation) {
            this->stress_n[ig] = astress_n;
            this->stress_m[ig] = astress_m;
            this->strain_e[ig] = astrain_e;
            this->strain_k[ig] = astrain_k;
        }

        // add viscous damping
        if (this->section->GetDamping()) {
            ChVector<> n_sp;
            ChVector<> m_sp;
            this->section->GetDamping()->ComputeStress(n_sp, m_sp, astrain_e_dt, astrain_k_dt);
            astress_n += n_sp;
            astress_m += m_sp;
        }

        // compute internal force, in generalized coordinates:

        ChVector<> stress_n_abs = R * astress_n;
        ChVector<> stress_m_abs = R * astress_m;

        for (int i = 0; i < nodes.size(); ++i) {
            // -Force_i = w * Jue * Jsu * Jsu^-1 * N' * R * C * (strain_e - strain_e0)
            //          = w * Jue                * N'         * stress_n_abs
            ChVector<> Force_i = stress_n_abs * N(1, i) * (-w * Jue);
            Fi.segment(i * 6, 3) += Force_i.eigen();

            // -Torque_i =   w * Jue * Jsu * Jsu^-1 * R_i^t * N'               * R * D * (strain_k - strain_k0) +
            //             + w * Jue * Jsu *          R_i^t * N * skew(r')^t   * R * C * (strain_e - strain_e0)
            //           =   w * Jue * R_i^t                * N'               * stress_m_abs +
            //             + w * Jue * Jsu * R_i^t          * N * skew(r')^t   * stress_n_abs
            ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
            ChVector<> Torque_i = q_i.RotateBack(stress_m_abs * N(1, i) * (-w * Jue) -
                                                 Vcross(dr, stress_n_abs) * N(0, i) * (-w * Jue * Jsu));
            Fi.segment(3 + i * 6, 3) += Torque_i.eigen();
        }

        // GetLog() << "     gp n." << ig <<   "  J=" << this->Jacobian[ig] << "   strain_e= " << strain_e << "\n";
        // GetLog() << "                    stress_n= " << stress_n << "\n";
    }

    // Add also inertial quadratic terms: gyroscopic and centrifugal

    if (ChElementBeamIGA::add_gyroscopic_terms == true) {
        if (ChElementBeamIGA::lumped_mass == true) {
            // CASE OF LUMPED MASS - faster
            double node_multiplier = length / (double)nodes.size();
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            for (int i = 0; i < nodes.size(); ++i) {
                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, state_w.segment(3 + i * 6, 3));
                ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                Fi.segment(i * 6, 3) -= node_multiplier * q_i.Rotate(mFcent_i).eigen();
                Fi.segment(3 + i * 6, 3) -= node_multiplier * mTgyro_i.eigen();
            }
        } else {
            // CASE OF CONSISTENT MASS
            ChVector<> mFcent_i;
            ChVector<> mTgyro_i;
            // evaluate inertial quadratic forces using same gauss points used for bending
            for (int ig = 0; ig < int_order_b; ++ig) {
                double eta = ChQuadrature::GetStaticTables()->Lroots[int_order_b - 1][ig];
                double u = (c1 * eta + c2);
                double w = ChQuadrature::GetStaticTables()->Weight[int_order_b - 1][ig];

                double Jsu = this->Jacobian_b[ig];
                double Jue = c1;
                int nspan = order;

                ChMatrixDynamic<> N(1, (int)nodes.size());  // row n.0 contains N, row n.1 contains dN/du
                geometry::ChBasisToolsBspline::BasisEvaluateDeriv(this->order, nspan, u, knots,
                                                                  N);  ///< here return N and dN/du

                // interpolate rotation of section at given u, to compute R.
                // Note: this is approximate.
                // A more precise method: use quaternion splines, as in Kim,Kim and Shin, 1995 paper.
                ChQuaternion<> q_delta;
                ChVector<> da = VNULL;
                ChVector<> delta_rot_dir;
                double delta_rot_angle;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    q_delta = nodes[0]->coord.rot.GetConjugate() * q_i;
                    q_delta.Q_to_AngAxis(delta_rot_angle,
                                         delta_rot_dir);  // a_i = dir_i*angle_i (in spline local reference, -PI..+PI)
                    da += delta_rot_dir * delta_rot_angle * N(0, i);  // a = N_i*a_i
                }
                ChQuaternion<> qda;
                qda.Q_from_Rotv(da);
                ChQuaternion<> qR = nodes[0]->coord.rot * qda;

                ChVector<> w_sect;
                for (int i = 0; i < nodes.size(); ++i) {
                    ChQuaternion<> q_i(state_x.segment(i * 7 + 3, 4));
                    ChVector<> wl_i(state_w.segment(i * 6 + 3, 3));  //  w in node csys
                    ChVector<> w_i = q_i.Rotate(wl_i);               // w in absolute csys
                    w_sect += w_i * N(0, i);
                }
                w_sect = qR.RotateBack(w_sect);  // w in sectional csys

                this->section->GetInertia()->ComputeQuadraticTerms(mFcent_i, mTgyro_i, w_sect);

                for (int i = 0; i < nodes.size(); ++i) {
                    Fi.segment(i * 6, 3) -= w * Jsu * Jue * N(0, i) * qR.Rotate(mFcent_i).eigen();
                    Fi.segment(3 + i * 6, 3) -= w * Jsu * Jue * N(0, i) * mTgyro_i.eigen();
                }
            }
        }
    }  // end quadratic inertial force terms
}